

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::ES5ArrayTypeHandlerBase<int>::SetInstanceTypeHandler
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,bool hasChanged)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ScriptContext *pSVar6;
  JavascriptArray *pJVar7;
  ExceptionBase anon_var_0;
  bool isCrossSiteObject;
  Type *oldType;
  bool doneConversion;
  JavascriptArray *arrayInstance;
  bool hasChanged_local;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  bVar2 = Js::JavascriptArray::IsNonES5Array(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                ,0x10e,"(JavascriptArray::IsNonES5Array(instance))",
                                "JavascriptArray::IsNonES5Array(instance)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
  if ((bVar3 & 0x20) != 0) {
    pSVar6 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    ScriptContextOptimizationOverrideInfo::DisableArraySetElementFastPath
              (&pSVar6->optimizationOverrides);
  }
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(instance);
  pJVar7 = VarTo<Js::JavascriptArray,Js::DynamicObject>(instance);
  pJVar7 = Js::JavascriptArray::EnsureNonNativeArray(pJVar7);
  RecyclableObject::GetType((RecyclableObject *)pJVar7);
  BVar4 = CrossSite::IsCrossSiteObjectTyped<Js::JavascriptArray>(pJVar7);
  if (BVar4 == 0) {
    bVar2 = VirtualTableInfo<Js::JavascriptArray>::HasVirtualTable(pJVar7);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                  ,0x127,
                                  "(VirtualTableInfo<JavascriptArray>::HasVirtualTable(arrayInstance))"
                                  ,
                                  "VirtualTableInfo<JavascriptArray>::HasVirtualTable(arrayInstance)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    VirtualTableInfo<Js::ES5Array>::SetVirtualTable(pJVar7);
  }
  else {
    bVar2 = VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptArray>_>::HasVirtualTable(pJVar7);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                  ,0x12d,
                                  "(VirtualTableInfo<CrossSiteObject<JavascriptArray>>::HasVirtualTable(arrayInstance))"
                                  ,
                                  "VirtualTableInfo<CrossSiteObject<JavascriptArray>>::HasVirtualTable(arrayInstance)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    VirtualTableInfo<Js::CrossSiteObject<Js::ES5Array>_>::SetVirtualTable(pJVar7);
  }
  DynamicObject::ChangeType((DynamicObject *)pJVar7);
  DynamicTypeHandler::SetInstanceTypeHandler
            ((DynamicTypeHandler *)this,(DynamicObject *)pJVar7,false);
  return;
}

Assistant:

void ES5ArrayTypeHandlerBase<T>::SetInstanceTypeHandler(DynamicObject* instance, bool hasChanged)
    {
        Assert(JavascriptArray::IsNonES5Array(instance));
        if (this->GetFlags() & DynamicTypeHandler::IsPrototypeFlag)
        {
            // We have ES5 array has array/object prototype, we can't use array fast path for set
            // as index could be readonly or be getter/setter in the prototype
            // TODO: we may be able to separate out the array fast path and the object array fast path
            // here.
            instance->GetScriptContext()->optimizationOverrides.DisableArraySetElementFastPath();
        }

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        JavascriptArray * arrayInstance = JavascriptArray::EnsureNonNativeArray(VarTo<JavascriptArray>(instance));
#if DBG
        bool doneConversion = false;
        Js::Type* oldType = arrayInstance->GetType();
#endif
        bool isCrossSiteObject = false;

        try
        {
            if (!CrossSite::IsCrossSiteObjectTyped(arrayInstance))
            {
                // Convert instance to an ES5Array
                Assert(VirtualTableInfo<JavascriptArray>::HasVirtualTable(arrayInstance));
                VirtualTableInfo<ES5Array>::SetVirtualTable(arrayInstance);
            }
            else
            {
                // If instance was a cross-site JavascriptArray, convert to a cross-site ES5Array
                Assert(VirtualTableInfo<CrossSiteObject<JavascriptArray>>::HasVirtualTable(arrayInstance));
                VirtualTableInfo<CrossSiteObject<ES5Array>>::SetVirtualTable(arrayInstance);
                isCrossSiteObject = true;
            }

            arrayInstance->ChangeType(); // force change TypeId
            __super::SetInstanceTypeHandler(arrayInstance, false); // after forcing the type change, we don't need to changeType again.
#if DBG
            doneConversion = true;
#endif
        }
        catch(Js::ExceptionBase)
        {
            Assert(!doneConversion);
            // change vtbl shouldn't OOM. revert back the vtable.
            if (isCrossSiteObject)
            {
                Assert(VirtualTableInfo<CrossSiteObject<ES5Array>>::HasVirtualTable(arrayInstance));
                VirtualTableInfo<CrossSiteObject<JavascriptArray>>::SetVirtualTable(arrayInstance);
            }
            else
            {
                Assert(VirtualTableInfo<ES5Array>::HasVirtualTable(arrayInstance));
                VirtualTableInfo<JavascriptArray>::SetVirtualTable(arrayInstance);
            }
            // The only allocation is in ChangeType, which won't have changed the type yet.
            Assert(arrayInstance->GetType() == oldType);
            throw;
        }
    }